

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_iterator_previous(void **param_1)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  _Bool _Var4;
  roaring64_bitmap_t *r;
  roaring64_iterator_t *it;
  uint64_t uVar5;
  unsigned_long uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  uint64_t v;
  roaring64_bulk_context_t context;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  unsigned_long local_50;
  roaring64_bulk_context_t local_48;
  
  r = roaring64_bitmap_create();
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_68,1000);
  local_48.high_bytes[0] = '\0';
  local_48.high_bytes[1] = '\0';
  local_48.high_bytes[2] = '\0';
  local_48.high_bytes[3] = '\0';
  local_48.high_bytes[4] = '\0';
  local_48.high_bytes[5] = '\0';
  local_48._6_2_ = 0;
  local_48.leaf = (roaring64_leaf_t *)0x0;
  uVar6 = 0;
  do {
    local_50 = uVar6;
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,
                 (iterator)
                 local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_50);
    }
    else {
      *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar6;
      local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    roaring64_bitmap_add_bulk(r,&local_48,local_50);
    puVar2 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar1 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = uVar6 + 10000;
  } while (uVar6 != 10000000);
  it = roaring64_iterator_create_last(r);
  uVar8 = ((long)puVar2 - (long)puVar1) * 0x20000000 - 0x100000000;
  uVar9 = uVar8 & 0xffffffff00000000;
  lVar3 = ((long)uVar8 >> 0x20) << 3;
  do {
    lVar7 = lVar3;
    uVar5 = roaring64_iterator_value(it);
    _assert_int_equal(uVar5,*(unsigned_long *)
                             ((long)local_68.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar7),
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x70f);
    _Var4 = roaring64_iterator_previous(it);
    uVar9 = uVar9 - 0x100000000;
    lVar3 = lVar7 + -8;
  } while (_Var4);
  _assert_int_equal((long)uVar9 >> 0x20,0xffffffffffffffff,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x712);
  _Var4 = roaring64_iterator_advance(it);
  _assert_true((ulong)_Var4,"roaring64_iterator_advance(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x715);
  uVar5 = roaring64_iterator_value(it);
  _assert_int_equal(uVar5,*(unsigned_long *)
                           ((long)local_68.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar7),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x717);
  _Var4 = roaring64_iterator_previous(it);
  _assert_true((ulong)!_Var4,"roaring64_iterator_previous(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x71a);
  roaring64_iterator_free(it);
  roaring64_bitmap_free(r);
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_iterator_previous) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> values;
    values.reserve(1000);
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 1000; ++i) {
        uint64_t v = i * 10000;
        values.push_back(v);
        roaring64_bitmap_add_bulk(r, &context, v);
    }
    int i = ((int)values.size()) - 1;
    roaring64_iterator_t* it = roaring64_iterator_create_last(r);
    do {
        assert_int_equal(roaring64_iterator_value(it), values[i]);
        i--;
    } while (roaring64_iterator_previous(it));
    assert_int_equal(i, -1);

    // Check that we can move forward from before the first entry.
    assert_true(roaring64_iterator_advance(it));
    i++;
    assert_int_equal(roaring64_iterator_value(it), values[i]);

    // Check that we can't move backward again.
    assert_false(roaring64_iterator_previous(it));

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}